

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::ConnectedInterfaceElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
          *intfaces)

{
  mapped_type *this_00;
  TPZGeoEl *pTVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  TPZCompElSide celside;
  _Self __tmp;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZInterfaceElement *intface;
  TPZCompElSide celneigh;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  ellist;
  TPZCompElSide local_e8;
  _Rb_tree_node_base *local_d8;
  map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
  *local_d0;
  _Rb_tree_node_base *local_c8;
  _Base_ptr local_c0;
  TPZGeoElSide local_b8;
  TPZGeoElSide local_a0;
  TPZGeoElSide local_88;
  long local_70;
  _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = intfaces;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  ConnectedElements(this,skeleton,leftright,
                    (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                     *)&local_60);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &local_60._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    local_c8 = p_Var2 + 1;
    p_Var4 = (_Base_ptr)&p_Var2[1]._M_parent;
    local_d8 = p_Var2;
    local_c0 = p_Var4;
LAB_011e8454:
    p_Var4 = *(_Base_ptr *)p_Var4;
    if (p_Var4 != local_c0) {
      local_e8.fEl = (TPZCompEl *)p_Var4->_M_left;
      local_e8.fSide = *(int *)&p_Var4->_M_right;
      TPZCompElSide::Reference(&local_a0,&local_e8);
      TPZGeoElSide::Neighbour(&local_b8,&local_a0);
      do {
        if (local_b8.fGeoEl == local_a0.fGeoEl) {
          pTVar1 = local_b8.fGeoEl;
          iVar3 = local_b8.fSide;
          if (local_b8.fSide == local_a0.fSide) goto LAB_011e854c;
        }
        TPZGeoElSide::Reference(&local_b8);
        if (local_70 != 0) {
          local_88.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)
               __dynamic_cast(local_70,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
          if (local_88.super_TPZSavable._vptr_TPZSavable != (_func_int **)0x0) {
            if (((local_e8.fEl == (TPZCompEl *)local_88.super_TPZSavable._vptr_TPZSavable[5]) &&
                (local_e8.fSide == *(int *)(local_88.super_TPZSavable._vptr_TPZSavable + 6))) ||
               ((local_e8.fEl == (TPZCompEl *)local_88.super_TPZSavable._vptr_TPZSavable[7] &&
                (local_e8.fSide == *(int *)(local_88.super_TPZSavable._vptr_TPZSavable + 8)))))
            goto LAB_011e8520;
          }
        }
        TPZGeoElSide::Neighbour(&local_88,&local_b8);
        local_b8.fSide = local_88.fSide;
        local_b8.fGeoEl = local_88.fGeoEl;
      } while( true );
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(local_d8);
  } while( true );
LAB_011e8520:
  this_00 = std::
            map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
            ::operator[](local_d0,(key_type_conflict1 *)local_c8);
  std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>::push_back
            (this_00,(value_type *)&local_88);
  pTVar1 = local_a0.fGeoEl;
  iVar3 = local_a0.fSide;
LAB_011e854c:
  if ((local_b8.fGeoEl == pTVar1) && (local_b8.fSide == iVar3)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x8b9);
  }
  goto LAB_011e8454;
}

Assistant:

void TPZMHMeshControl::ConnectedInterfaceElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZInterfaceElement *> > &intfaces)
{
    std::map<int64_t, std::list<TPZCompElSide> > ellist;
    ConnectedElements(skeleton, leftright, ellist);
    // neighbour to each element there is an interface element
    for (std::map<int64_t, std::list<TPZCompElSide> >::iterator it = ellist.begin(); it != ellist.end(); it++) {
        std::list<TPZCompElSide> &loclist = it->second;
        for (std::list<TPZCompElSide>::iterator it2 = loclist.begin(); it2 != loclist.end(); it2++) {
            TPZCompElSide celside = *it2;
            TPZGeoElSide gelside = celside.Reference();
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                TPZCompElSide celneigh = neighbour.Reference();
                if (celneigh) {
                    TPZInterfaceElement *intface = dynamic_cast<TPZInterfaceElement *>(celneigh.Element());
                    if (intface && (intface->LeftElementSide() == celside || intface->RightElementSide() == celside)) {
                        intfaces[it->first].push_back(intface);
                        break;
                    }
                }
                neighbour = neighbour.Neighbour();
            }
            if (neighbour == gelside) {
                DebugStop();
            }
        }
    }
}